

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O3

Value * duckdb::PragmaFunctionExtractor::GetParameterTypes
                  (Value *__return_storage_ptr__,PragmaFunctionCatalogEntry *entry,idx_t offset)

{
  Value *pVVar1;
  reference this;
  __node_base _Var2;
  size_type __n;
  vector<duckdb::Value,_true> results;
  PragmaFunction fun;
  pointer local_1a8;
  pointer pVStack_1a0;
  pointer local_198;
  string local_190;
  Value *local_170;
  vector<duckdb::Value,_true> local_168;
  PragmaFunction local_148;
  
  local_1a8 = (pointer)0x0;
  pVStack_1a0 = (pointer)0x0;
  local_198 = (pointer)0x0;
  local_170 = __return_storage_ptr__;
  FunctionSet<duckdb::PragmaFunction>::GetFunctionByOffset
            (&local_148,&(entry->functions).super_FunctionSet<duckdb::PragmaFunction>,offset);
  if (local_148.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_148.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this = vector<duckdb::LogicalType,_true>::operator[]
                       (&local_148.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments
                        ,__n);
      LogicalType::ToString_abi_cxx11_(&local_190,this);
      ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<std::__cxx11::string>
                ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)local_148.super_SimpleNamedParameterFunction.super_SimpleFunction.
                                  arguments.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_148.super_SimpleNamedParameterFunction.super_SimpleFunction.
                                  arguments.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  if (local_148.named_parameters._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var2._M_nxt = local_148.named_parameters._M_h._M_before_begin._M_nxt;
    do {
      LogicalType::ToString_abi_cxx11_(&local_190,(LogicalType *)(_Var2._M_nxt + 5));
      ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<std::__cxx11::string>
                ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt;
    } while (_Var2._M_nxt != (_Hash_node_base *)0x0);
  }
  LogicalType::LogicalType((LogicalType *)&local_190,VARCHAR);
  pVVar1 = local_170;
  local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_1a8;
  local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_1a0;
  local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_198;
  local_1a8 = (pointer)0x0;
  pVStack_1a0 = (pointer)0x0;
  local_198 = (pointer)0x0;
  Value::LIST(local_170,(LogicalType *)&local_190,&local_168);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_168);
  LogicalType::~LogicalType((LogicalType *)&local_190);
  local_148.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02442970;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_148.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_148.super_SimpleNamedParameterFunction);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1a8);
  return pVVar1;
}

Assistant:

static Value GetParameterTypes(PragmaFunctionCatalogEntry &entry, idx_t offset) {
		vector<Value> results;
		auto fun = entry.functions.GetFunctionByOffset(offset);

		for (idx_t i = 0; i < fun.arguments.size(); i++) {
			results.emplace_back(fun.arguments[i].ToString());
		}
		for (auto &param : fun.named_parameters) {
			results.emplace_back(param.second.ToString());
		}
		return Value::LIST(LogicalType::VARCHAR, std::move(results));
	}